

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void deqp::gles3::Functional::anon_unknown_0::verifyUniformValue1f
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,float x)

{
  ostringstream *this;
  bool bVar1;
  StateQueryMemoryWriteGuard<float[1]> state;
  MessageBuilder local_1a8;
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[1]>::StateQueryMemoryWriteGuard
            (&state);
  glu::CallLogWrapper::glGetUniformfv(gl,program,location,state.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[1]>::verifyValidity
                    (&state,testCtx);
  if (bVar1) {
    if ((state.m_value[0] != x) || (NAN(state.m_value[0]) || NAN(x))) {
      local_1a8.m_log = testCtx->m_log;
      this = &local_1a8.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
      std::operator<<((ostream *)this,"// ERROR: expected [");
      std::ostream::operator<<(this,x);
      std::operator<<((ostream *)this,"]; got [");
      std::ostream::operator<<(this,state.m_value[0]);
      std::operator<<((ostream *)this,"]");
      tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
      if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
      }
    }
  }
  return;
}

Assistant:

void verifyUniformValue1f (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, float x)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[1]> state;
	gl.glGetUniformfv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state[0] != x)
	{
		testCtx.getLog() << TestLog::Message
		<< "// ERROR: expected ["
		<< x
		<< "]; got ["
		<< state[0]
		<< "]"
		<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
	}
}